

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall Clasp::Solver::propagateFrom(Solver *this,PostPropagator *p)

{
  bool bVar1;
  Solver *this_00;
  PostPropagator *in_RSI;
  PostPropagator **in_RDI;
  PostPropagator **r;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  this_00 = (Solver *)in_RDI[0x11];
  while( true ) {
    if (*(long *)this_00 == 0) {
      return true;
    }
    if (*(PostPropagator **)this_00 == in_RSI) break;
    this_00 = (Solver *)(*(long *)this_00 + 8);
  }
  bVar1 = postPropagate((Solver *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                        in_RDI,in_RSI);
  if (bVar1) {
    return true;
  }
  cancelPropagation(this_00);
  return false;
}

Assistant:

bool Solver::propagateFrom(PostPropagator* p) {
	assert((p && *postHead_) && "OP not allowed during init!");
	assert(queueSize() == 0);
	for (PostPropagator** r = postHead_; *r;) {
		if      (*r != p)             { r = &(*r)->next; }
		else if (postPropagate(r, 0)) { break; }
		else {
			cancelPropagation();
			return false;
		}
	}
	assert(queueSize() == 0);
	return true;
}